

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdcat.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  
  lafe_setprogname(*argv,"bsdcat");
  iVar1 = getopt(argc,argv,"h-");
  if (iVar1 == -1) {
    bsdcat_next();
    if (_optind < argc) {
      while (_optind < argc) {
        bsdcat_current_path = argv[_optind];
        _optind = _optind + 1;
        bsdcat_read_to_stdout(bsdcat_current_path);
        bsdcat_next();
      }
    }
    else {
      bsdcat_current_path = "<stdin>";
      bsdcat_read_to_stdout((char *)0x0);
    }
    exit(exit_status);
  }
  if (iVar1 == 0x68) {
LAB_0010672e:
    usage(_stdout,0);
  }
  else {
    if (iVar1 != 0x2d) goto LAB_00106752;
    argv = (char **)argv[_optind];
    iVar1 = strcmp((char *)argv,"--version");
    if (iVar1 == 0) {
      pcVar2 = archive_version_details();
      printf("bsdcat %s - %s\n","3.1.2",pcVar2);
      exit(0);
    }
    iVar1 = strcmp((char *)argv,"--help");
    if (iVar1 == 0) goto LAB_0010672e;
  }
  lafe_warnc(0,"invalid option -- \'%s\'",argv);
LAB_00106752:
  usage(_stderr,1);
  return (int)lafe_progname;
}

Assistant:

int
main(int argc, char **argv)
{
	int c;

	lafe_setprogname(*argv, "bsdcat");

	while ((c = getopt(argc, argv, "h-")) != -1) {
		switch (c) {
			case '-':
				if (strcmp(argv[optind], "--version") == 0)
					version();
				if (strcmp(argv[optind], "--help") != 0) {
					lafe_warnc(0, "invalid option -- '%s'", argv[optind]);
					usage(stderr, 1);
				}
			case 'h':
				usage(stdout, 0);
			default:
				usage(stderr, 1);
		}
	}

	bsdcat_next();
	if (optind >= argc) {
		bsdcat_current_path = "<stdin>";
		bsdcat_read_to_stdout(NULL);
	} else
		while (optind < argc) {
			bsdcat_current_path = argv[optind++];
			bsdcat_read_to_stdout(bsdcat_current_path);
			bsdcat_next();
		}

	exit(exit_status);
}